

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall Fluid::pressure_solve(Fluid *this)

{
  Program *this_00;
  Program *this_01;
  int iVar1;
  
  this_00 = &this->jacobi_iterate_program;
  gfx::Program::use(this_00);
  set_common_uniforms(this,this_00);
  (*glad_glValidateProgram)((this->jacobi_iterate_program).id);
  gfx::Program::check_validation(this_00,(this->jacobi_iterate_program).id);
  this_01 = &this->pressure_to_guess_program;
  gfx::Program::use(this_01);
  set_common_uniforms(this,this_01);
  (*glad_glValidateProgram)((this->pressure_to_guess_program).id);
  gfx::Program::check_validation(this_01,(this->pressure_to_guess_program).id);
  iVar1 = 0x28;
  do {
    (*glad_glMemoryBarrier)(0xffffffff);
    gfx::Program::use(this_00);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
    (*glad_glMemoryBarrier)(0xffffffff);
    gfx::Program::use(this_01);
    (*glad_glDispatchCompute)
              ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
               (this->grid_dimensions).field_2.z);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void pressure_solve() {
        const int iters = 40;

        jacobi_iterate_program.use();
        set_common_uniforms(jacobi_iterate_program);
        jacobi_iterate_program.validate();

        pressure_to_guess_program.use();
        set_common_uniforms(pressure_to_guess_program);
        pressure_to_guess_program.validate();

        for (int i = 0; i < iters; ++i) {
            ssbo_barrier();
            jacobi_iterate_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);

            ssbo_barrier();
            pressure_to_guess_program.use();
            glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        }
    }